

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangle.cpp
# Opt level: O2

bool __thiscall chrono::geometry::ChTriangle::Normal(ChTriangle *this,ChVector<double> *N)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 local_28 [16];
  double local_18;
  undefined1 extraout_var [56];
  
  auVar2 = *(undefined1 (*) [16])((this->p1).m_data + 1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->p3).m_data[2];
  dVar3 = (this->p1).m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar3;
  auVar5 = vmovhpd_avx(auVar9,(this->p3).m_data[0]);
  auVar9 = vsubpd_avx(*(undefined1 (*) [16])((this->p2).m_data + 1),auVar2);
  dVar1 = (this->p1).m_data[2];
  auVar11._8_8_ = dVar1;
  auVar11._0_8_ = dVar1;
  auVar4 = vunpcklpd_avx(auVar11,auVar4);
  auVar4 = vsubpd_avx(auVar5,auVar4);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->p2).m_data[0] - dVar3;
  auVar5 = vshufpd_avx(auVar9,auVar7,1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->p3).m_data[1] - auVar2._0_8_;
  auVar2 = vunpcklpd_avx(auVar8,auVar4);
  auVar10._0_8_ = auVar2._0_8_ * auVar5._0_8_;
  auVar10._8_8_ = auVar2._8_8_ * auVar5._8_8_;
  local_28 = vfmsub231pd_fma(auVar10,auVar9,auVar4);
  auVar2 = vshufpd_avx(auVar4,auVar4,1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar2._0_8_ * auVar9._0_8_;
  auVar2 = vfmsub231sd_fma(auVar5,auVar7,auVar8);
  local_18 = auVar2._0_8_;
  auVar6._0_8_ = ChVector<double>::Length((ChVector<double> *)local_28);
  auVar6._8_56_ = extraout_var;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar2 = vandpd_avx512vl(auVar6._0_16_,auVar2);
  if (1e-20 < auVar2._0_8_) {
    dVar3 = 1.0 / auVar6._0_8_;
    N->m_data[0] = dVar3 * (double)local_28._0_8_;
    N->m_data[1] = dVar3 * (double)local_28._8_8_;
    N->m_data[2] = dVar3 * local_18;
  }
  return 1e-20 < auVar2._0_8_;
}

Assistant:

bool ChTriangle::Normal(ChVector<>& N) const {
    ChVector<> u;
    u = Vsub(p2, p1);
    ChVector<> v;
    v = Vsub(p3, p1);

    ChVector<> n;
    n = Vcross(u, v);

    double len = Vlength(n);

    if (fabs(len) > EPS_TRIDEGENERATE)
        N = Vmul(n, (1.0 / len));
    else
        return false;

    return true;
}